

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Promise<void> __thiscall
capnp::
Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
::sendIgnoringResult
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
           *this)

{
  RequestHook *pRVar1;
  long in_RSI;
  undefined1 local_48 [8];
  RemotePromise<capnp::AnyPointer> typelessPromise;
  Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
  *this_local;
  
  pRVar1 = kj::Own<capnp::RequestHook,_std::nullptr_t>::operator->
                     ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x28));
  (**pRVar1->_vptr_RequestHook)(local_48);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::operator=
            ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x28),(void *)0x0);
  kj::mv<capnp::RemotePromise<capnp::AnyPointer>>((RemotePromise<capnp::AnyPointer> *)local_48);
  kj::Promise<capnp::Response<capnp::AnyPointer>_>::ignoreResult
            ((Promise<capnp::Response<capnp::AnyPointer>_> *)this);
  RemotePromise<capnp::AnyPointer>::~RemotePromise((RemotePromise<capnp::AnyPointer> *)local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Request<Params, Results>::sendIgnoringResult() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse
  return kj::mv(typelessPromise).ignoreResult();
}